

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

Var Js::JavascriptPromise::EntryThunkFinallyFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  Var object;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptPromiseThunkFinallyFunction *pJVar4;
  int in_stack_00000010;
  undefined1 local_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x420,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00cff41f;
    *puVar3 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_30,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x421,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
LAB_00cff41f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = VarTo<Js::JavascriptPromiseThunkFinallyFunction,Js::RecyclableObject>(function);
  object = (pJVar4->value).ptr;
  if (pJVar4->shouldThrow == false) {
    return object;
  }
  JavascriptExceptionOperators::Throw
            (object,(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
                    .scriptContext.ptr);
}

Assistant:

Var JavascriptPromise::EntryThunkFinallyFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptPromiseThunkFinallyFunction* thunkFinallyFunction = VarTo<JavascriptPromiseThunkFinallyFunction>(function);

        if (!thunkFinallyFunction->GetShouldThrow())
        {
            return thunkFinallyFunction->GetValue();
        }
        else
        {
            JavascriptExceptionOperators::Throw(thunkFinallyFunction->GetValue(), function->GetScriptContext());
        }
    }